

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

void __thiscall tinyusdz::crate::CrateReader::~CrateReader(CrateReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pSVar3;
  pointer pIVar4;
  pointer pFVar5;
  pointer pSVar6;
  
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->unpackRecursionGuard)._M_h);
  pcVar2 = (this->_warn)._M_dataplus._M_p;
  paVar1 = &(this->_warn).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_err)._M_dataplus._M_p;
  paVar1 = &(this->_err).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ::std::
  _Rb_tree<tinyusdz::crate::Index,_std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>,_std::_Select1st<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::_M_erase(&(this->_live_fieldsets)._M_t,
             (_Link_type)
             (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  ~vector(&this->_nodes);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_elemPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  pSVar3 = (this->_specs).
           super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->_specs).
                                 super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  pIVar4 = (this->_fieldset_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar4 != (pointer)0x0) {
    operator_delete(pIVar4,(long)(this->_fieldset_indices).
                                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar4);
  }
  pFVar5 = (this->_fields).
           super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pFVar5 != (pointer)0x0) {
    operator_delete(pFVar5,(long)(this->_fields).
                                 super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar5);
  }
  pIVar4 = (this->_string_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar4 != (pointer)0x0) {
    operator_delete(pIVar4,(long)(this->_string_indices).
                                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar4);
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&this->_tokens);
  pSVar6 = (this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar6 != (pointer)0x0) {
    operator_delete(pSVar6,(long)(this->_toc).sections.
                                 super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar6);
    return;
  }
  return;
}

Assistant:

CrateReader::~CrateReader() {
  //delete _impl;
  //_impl = nullptr;
}